

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  TestError *this_00;
  long *plVar3;
  long lVar4;
  long *plVar5;
  undefined1 *puVar6;
  string shader_source;
  string input [3];
  long local_168;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 *local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"    x[ivec2(0)] = 1.0;\n\n","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"    x[ivec3(0)] = 1.0;\n\n","");
  plVar5 = local_48;
  local_58[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"    x[ivec4(0)] = 1.0;\n\n","");
  local_168 = 2;
  puVar6 = local_90;
  do {
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"    float x","");
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"[2]","");
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_b8,this,local_f8,(string *)local_d8,local_168);
    plVar1 = (long *)std::__cxx11::string::replace
                               ((ulong)local_b8,0,(char *)0x0,shader_start_abi_cxx11_);
    local_158 = &local_148;
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_148 = *plVar3;
      lStack_140 = plVar1[3];
    }
    else {
      local_148 = *plVar3;
      local_158 = (long *)*plVar1;
    }
    local_150 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_138 = &local_128;
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_128 = *plVar3;
      lStack_120 = plVar1[3];
    }
    else {
      local_128 = *plVar3;
      local_138 = (long *)*plVar1;
    }
    local_130 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_138,*(ulong *)(puVar6 + -8));
    local_118 = &local_108;
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_108 = *plVar3;
      lStack_100 = plVar1[3];
    }
    else {
      local_108 = *plVar3;
      local_118 = (long *)*plVar1;
    }
    local_110 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0],local_c8[0] + 1);
    }
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0],local_e8[0] + 1);
    }
    puVar2 = &set_tesseation_abi_cxx11_;
    switch((ulong)tested_shader_type) {
    case 0:
    case 2:
    case 5:
      break;
    case 1:
      std::__cxx11::string::append((char *)&local_118);
      break;
    case 3:
      puVar2 = &emit_quad_abi_cxx11_;
    case 4:
      std::__cxx11::string::_M_append((char *)&local_118,*puVar2);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xcf2);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_118,shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)tested_shader_type,&local_118);
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    local_168 = local_168 + 1;
    puVar6 = puVar6 + 0x20;
  } while (local_168 != 5);
  lVar4 = -0x60;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  return;
}

Assistant:

void ExpressionsIndexingArray3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string input[] = { "    x[ivec2(0)] = 1.0;\n\n", "    x[ivec3(0)] = 1.0;\n\n", "    x[ivec4(0)] = 1.0;\n\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source = shader_start + this->extend_string("    float x", "[2]", (int)string_index + 2) +
									";\n\n" + input[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}